

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O0

void __thiscall
ON_RenderContentPrivate::InternalSetPropertyValue
          (ON_RenderContentPrivate *this,wchar_t *name,ON_XMLVariant *value)

{
  ON_XMLProperty *this_00;
  ON_wString local_30;
  ON_XMLProperty *local_28;
  ON_XMLProperty *pProp;
  ON_XMLVariant *value_local;
  wchar_t *name_local;
  ON_RenderContentPrivate *this_local;
  
  pProp = (ON_XMLProperty *)value;
  value_local = (ON_XMLVariant *)name;
  name_local = (wchar_t *)this;
  local_28 = ON_XMLNode::GetNamedProperty(&this->m_node,name);
  if (local_28 == (ON_XMLProperty *)0x0) {
    this_00 = (ON_XMLProperty *)operator_new(0x68);
    ON_wString::ON_wString(&local_30,(wchar_t *)value_local);
    ON_XMLProperty::ON_XMLProperty(this_00,&local_30,(ON_XMLVariant *)pProp);
    local_28 = ON_XMLNode::AttachProperty(&this->m_node,this_00);
    ON_wString::~ON_wString(&local_30);
  }
  else {
    (*local_28->_vptr_ON_XMLProperty[8])(local_28,pProp);
  }
  return;
}

Assistant:

void ON_RenderContentPrivate::InternalSetPropertyValue(const wchar_t* name, const ON_XMLVariant& value)
{
  // Sets a property on the content node. This is one of:
  //
  // - the material node <material... >
  // - the environment node <environment... >
  // - the texture node <texture... >

  ON_XMLProperty* pProp = m_node.GetNamedProperty(name);
  if (nullptr != pProp)
  {
    pProp->SetValue(value);
  }
  else
  {
    pProp = m_node.AttachProperty(new ON_XMLProperty(name, value));
  }
}